

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O3

void __thiscall
TEST_SimpleString_StringFromFormatpointer_Test::testBody
          (TEST_SimpleString_StringFromFormatpointer_Test *this)

{
  size_t sVar1;
  UtestShell *pUVar2;
  char *pcVar3;
  TestTerminator *pTVar4;
  char *pcVar5;
  undefined8 uVar6;
  SimpleString h1;
  SimpleString local_20;
  
  StringFromFormat((char *)&local_20,"%p",1);
  sVar1 = SimpleString::size(&local_20);
  if (sVar1 == 3) {
    pUVar2 = UtestShell::getCurrent();
    pcVar3 = SimpleString::asCharString(&local_20);
    pTVar4 = UtestShell::getCurrentTestTerminator();
    uVar6 = 0x2e0;
    pcVar5 = "0x1";
  }
  else {
    sVar1 = SimpleString::size(&local_20);
    if (sVar1 == 8) {
      pUVar2 = UtestShell::getCurrent();
      pcVar3 = SimpleString::asCharString(&local_20);
      pTVar4 = UtestShell::getCurrentTestTerminator();
      uVar6 = 0x2e2;
      pcVar5 = "00000001";
    }
    else {
      sVar1 = SimpleString::size(&local_20);
      if (sVar1 == 9) {
        pUVar2 = UtestShell::getCurrent();
        pcVar3 = SimpleString::asCharString(&local_20);
        pTVar4 = UtestShell::getCurrentTestTerminator();
        uVar6 = 0x2e4;
        pcVar5 = "0000:0001";
      }
      else {
        sVar1 = SimpleString::size(&local_20);
        if (sVar1 == 0x10) {
          pUVar2 = UtestShell::getCurrent();
          pcVar3 = SimpleString::asCharString(&local_20);
          pTVar4 = UtestShell::getCurrentTestTerminator();
          uVar6 = 0x2e6;
          pcVar5 = "0000000000000001";
        }
        else {
          sVar1 = SimpleString::size(&local_20);
          if (sVar1 != 1) {
            pUVar2 = UtestShell::getCurrent();
            pTVar4 = UtestShell::getCurrentTestTerminator();
            (*pUVar2->_vptr_UtestShell[0x1a])
                      (pUVar2,"Off %p behavior",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
                       ,0x2ea,pTVar4);
            goto LAB_0026f71a;
          }
          pUVar2 = UtestShell::getCurrent();
          pcVar3 = SimpleString::asCharString(&local_20);
          pTVar4 = UtestShell::getCurrentTestTerminator();
          uVar6 = 0x2e8;
          pcVar5 = "1";
        }
      }
    }
  }
  (*pUVar2->_vptr_UtestShell[9])
            (pUVar2,pcVar5,pcVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,uVar6,pTVar4);
LAB_0026f71a:
  SimpleString::~SimpleString(&local_20);
  return;
}

Assistant:

TEST(SimpleString, StringFromFormatpointer)
{
    //this is not a great test. but %p is odd on mingw and even more odd on Solaris.
    SimpleString h1 = StringFromFormat("%p", (void*) 1);
    if (h1.size() == 3)
        STRCMP_EQUAL("0x1", h1.asCharString());
    else if (h1.size() == 8)
        STRCMP_EQUAL("00000001", h1.asCharString());
    else if (h1.size() == 9)
        STRCMP_EQUAL("0000:0001", h1.asCharString());
    else if (h1.size() == 16)
        STRCMP_EQUAL("0000000000000001", h1.asCharString());
    else if (h1.size() == 1)
        STRCMP_EQUAL("1", h1.asCharString());
    else
        FAIL("Off %p behavior");
}